

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O3

string * __thiscall
lan::db::write_bit_abi_cxx11_(string *__return_storage_ptr__,db *this,db_bit *bit,bool in_array)

{
  string local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((int)bit->type < 9) {
    write_var_bit_abi_cxx11_(&local_38,this,bit,in_array);
  }
  else if (bit->type == Array) {
    write_array_bit_abi_cxx11_(&local_38,this,bit);
  }
  else {
    write_container_bit_abi_cxx11_(&local_38,this,bit);
  }
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string db::write_bit(db_bit * bit, bool in_array){
            std::string bit_str;
            if(bit->type <= Unsafe){
                bit_str = write_var_bit(bit, in_array);
            } else if(bit->type == Array){
                bit_str = write_array_bit(bit);
            } else {
                bit_str = write_container_bit(bit);
            } return bit_str;
        }